

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void deqp::gls::FboUtil::config::glInitFlat(TextureFlat *cfg,GLenum target,Functions *gl)

{
  ImageFormat *imgFormat;
  undefined4 uVar1;
  undefined4 uVar2;
  TransferFormat TVar3;
  GLint level;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iStack_40;
  int iStack_3c;
  
  imgFormat = &(cfg->super_Texture).super_Image.internalFormat;
  TVar3 = transferImageFormat(imgFormat);
  uVar1 = (cfg->super_Texture).super_Image.width;
  uVar2 = (cfg->super_Texture).super_Image.height;
  auVar6._4_4_ = uVar2;
  auVar6._0_4_ = uVar1;
  auVar6._8_8_ = 0;
  for (iVar4 = 0; iVar4 < (cfg->super_Texture).numLevels; iVar4 = iVar4 + 1) {
    (*gl->texImage2D)(target,iVar4,imgFormat->format,auVar6._0_4_,auVar6._4_4_,0,TVar3.format,
                      TVar3.dataType,(void *)0x0);
    iStack_40 = auVar6._8_4_;
    iStack_3c = auVar6._12_4_;
    auVar5._0_4_ = auVar6._0_4_ / 2;
    auVar5._4_4_ = auVar6._4_4_ / 2;
    auVar5._8_4_ = iStack_40 / 2;
    auVar5._12_4_ = iStack_3c / 2;
    auVar7._0_4_ = -(uint)((int)DAT_005ba250 < auVar5._0_4_);
    auVar7._4_4_ = -(uint)(DAT_005ba250._4_4_ < auVar5._4_4_);
    auVar7._8_4_ = -(uint)(DAT_005ba250._8_4_ < auVar5._8_4_);
    auVar7._12_4_ = -(uint)(DAT_005ba250._12_4_ < auVar5._12_4_);
    auVar6 = ~auVar7 & _DAT_005ba250 | auVar5 & auVar7;
  }
  return;
}

Assistant:

static void glInitFlat (const TextureFlat& cfg, GLenum target, const glw::Functions& gl)
{
	const TransferFormat format = transferImageFormat(cfg.internalFormat);
	GLint w = cfg.width;
	GLint h = cfg.height;
	for (GLint level = 0; level < cfg.numLevels; level++)
	{
		gl.texImage2D(target, level, cfg.internalFormat.format, w, h, 0,
					  format.format, format.dataType, DE_NULL);
		w = de::max(1, w / 2);
		h = de::max(1, h / 2);
	}
}